

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteFloatArray
               (float *a,int n,CodedOutputStream *output)

{
  CodedOutputStream *output_local;
  int n_local;
  float *a_local;
  
  WriteArray<float>(a,n,output);
  return;
}

Assistant:

void WireFormatLite::WriteFloatArray(const float* a, int n,
                                     io::CodedOutputStream* output) {
  WriteArray<float>(a, n, output);
}